

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inet.c
# Opt level: O2

int inet_ntop4(uchar *src,char *dst,size_t size)

{
  uint uVar1;
  int iVar2;
  char tmp [16];
  
  iVar2 = 0;
  uVar1 = snprintf(tmp,0x10,"%u.%u.%u.%u",(ulong)*src,(ulong)src[1],(ulong)src[2],(uint)src[3]);
  if (uVar1 < size && 0 < (int)uVar1) {
    strncpy(dst,tmp,size);
    dst[size - 1] = '\0';
  }
  else {
    iVar2 = -0x1c;
  }
  return iVar2;
}

Assistant:

static int inet_ntop4(const unsigned char *src, char *dst, size_t size) {
  static const char fmt[] = "%u.%u.%u.%u";
  char tmp[UV__INET_ADDRSTRLEN];
  int l;

  l = snprintf(tmp, sizeof(tmp), fmt, src[0], src[1], src[2], src[3]);
  if (l <= 0 || (size_t) l >= size) {
    return UV_ENOSPC;
  }
  strncpy(dst, tmp, size);
  dst[size - 1] = '\0';
  return 0;
}